

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UTF8Test_encode_codepoint_Test::UTF8Test_encode_codepoint_Test(UTF8Test_encode_codepoint_Test *this)

{
  UTF8Test_encode_codepoint_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__UTF8Test_encode_codepoint_Test_00812c10;
  return;
}

Assistant:

TEST(UTF8Test, encode_codepoint) {
	EXPECT_EQ(encode_codepoint_u8(U'\0'), u8"\0"sv);
	EXPECT_EQ(encode_codepoint_u8(U'A'), u8"A"sv);
	EXPECT_EQ(encode_codepoint_u8(U'z'), u8"z"sv);
	EXPECT_EQ(encode_codepoint_u8(U'\u007F'), u8"\u007F"sv);
	EXPECT_EQ(encode_codepoint_u8(U'\u0080'), u8"\u0080"sv);
	EXPECT_EQ(encode_codepoint_u8(U'\u07FF'), u8"\u07FF"sv);
	EXPECT_EQ(encode_codepoint_u8(U'\u0800'), u8"\u0800"sv);
	EXPECT_EQ(encode_codepoint_u8(U'\uFFFF'), u8"\uFFFF"sv);
	EXPECT_EQ(encode_codepoint_u8(U'\U00010000'), u8"\U00010000"sv);
	EXPECT_EQ(encode_codepoint_u8(U'\U0010FFFF'), u8"\U0010FFFF"sv);
	EXPECT_EQ(encode_codepoint_u8(U'\U0001F604'), u8"\U0001F604"sv);
}